

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_signal.c
# Opt level: O1

void block_signal(int sig,_Bool block_it)

{
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  sigset_t ss;
  sigset_t sStack_98;
  
  sigemptyset(&sStack_98);
  sigaddset(&sStack_98,sig);
  uVar5 = (ulong)block_it ^ 1;
  iVar1 = sigprocmask((int)uVar5,&sStack_98,(sigset_t *)0x0);
  if (-1 < iVar1) {
    return;
  }
  block_signal_cold_1();
  uVar6 = uVar5 & 0xffffffff;
  uVar2 = fcntl((int)uVar5,1);
  if ((int)uVar2 < 0) {
    cloexec_cold_2();
  }
  else {
    iVar1 = fcntl((int)uVar5,2,(ulong)(uVar2 | 1));
    if (-1 < iVar1) {
      return;
    }
  }
  cloexec_cold_1();
  pcVar4 = (char *)(uVar6 & 0xffffffff);
  uVar2 = fcntl((int)uVar6,1);
  if ((int)uVar2 < 0) {
    noncloexec_cold_2();
  }
  else {
    iVar1 = fcntl((int)uVar6,2,(ulong)(uVar2 & 0x7ffffffe));
    if (-1 < iVar1) {
      return;
    }
  }
  noncloexec_cold_1();
  puVar3 = (undefined8 *)safemalloc(1,8,0);
  pcVar4 = dupstr(pcVar4);
  *puVar3 = pcVar4;
  return;
}

Assistant:

void block_signal(int sig, bool block_it)
{
    sigset_t ss;

    sigemptyset(&ss);
    sigaddset(&ss, sig);
    if(sigprocmask(block_it ? SIG_BLOCK : SIG_UNBLOCK, &ss, 0) < 0) {
        perror("sigprocmask");
        exit(1);
    }
}